

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info.cpp
# Opt level: O1

profiler_settings_t * duckdb::ProfilingInfo::DefaultSettings(void)

{
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *in_RDI;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 local_c;
  undefined1 local_a [2];
  
  local_18 = 0x6050d0403020100;
  local_10 = 0xa090807;
  local_c = 0xc0b;
  ::std::
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<duckdb::MetricsType_const*>(in_RDI,&local_18,local_a,0,&local_19,&local_1a,&local_1b)
  ;
  return (profiler_settings_t *)in_RDI;
}

Assistant:

profiler_settings_t ProfilingInfo::DefaultSettings() {
	return {MetricsType::QUERY_NAME,
	        MetricsType::BLOCKED_THREAD_TIME,
	        MetricsType::CPU_TIME,
	        MetricsType::EXTRA_INFO,
	        MetricsType::CUMULATIVE_CARDINALITY,
	        MetricsType::OPERATOR_NAME,
	        MetricsType::OPERATOR_TYPE,
	        MetricsType::OPERATOR_CARDINALITY,
	        MetricsType::CUMULATIVE_ROWS_SCANNED,
	        MetricsType::OPERATOR_ROWS_SCANNED,
	        MetricsType::OPERATOR_TIMING,
	        MetricsType::RESULT_SET_SIZE,
	        MetricsType::LATENCY,
	        MetricsType::ROWS_RETURNED};
}